

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_is_quad_uniform_control_flow(Impl *this,SPIRVModule *module)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  Op OVar1;
  Block *pBVar2;
  Id IVar3;
  Function *pFVar4;
  pointer pIVar5;
  pointer pIVar6;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1c8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1c0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1b8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1b0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1a8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1a0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_198;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_190;
  Id local_184;
  undefined4 local_180;
  Id result_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_178;
  __single_object extract_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_168;
  __single_object and_invocation_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_158;
  __single_object load_invocation_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_148;
  __single_object or_1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_138;
  __single_object shift_1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_128;
  __single_object or_2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_118;
  __single_object shift_2;
  Id local_108;
  Id local_104;
  Id local_100;
  Id local_fc;
  iterator local_f8;
  undefined8 local_f0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_e8;
  allocator_type local_c9;
  Id local_c8;
  Id local_c4;
  Id local_c0;
  Id local_bc;
  iterator local_b8;
  undefined8 local_b0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_a8;
  Id local_90;
  Id local_8c;
  Id uint_1;
  Id uint_2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_80;
  __single_object ballot_op;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_60;
  Function *local_48;
  Function *func;
  Op local_38;
  Id bool_type;
  Id uvec4_type;
  Id uint_type;
  Block *entry;
  Block *current_build_point;
  SPIRVModule *module_local;
  Impl *this_local;
  
  if (this->is_quad_uniform_call_id == 0) {
    current_build_point = (Block *)module;
    module_local = (SPIRVModule *)this;
    entry = spv::Builder::getBuildPoint(&this->builder);
    _uvec4_type = (Block *)0x0;
    bool_type = spv::Builder::makeUintType(&this->builder,0x20);
    local_38 = spv::Builder::makeVectorType(&this->builder,bool_type,4);
    IVar3 = spv::Builder::makeBoolType(&this->builder);
    func._4_4_ = IVar3;
    memset(&local_60,0,0x18);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector(&local_60);
    memset(&ballot_op,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)&ballot_op);
    pFVar4 = spv::Builder::makeFunctionEntry
                       (&this->builder,DecorationMax,IVar3,"IsQuadUniformControlFlow",&local_60,
                        (Vector<dxil_spv::Vector<Decoration>_> *)&ballot_op,(Block **)&uvec4_type);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)&ballot_op);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_60);
    local_48 = pFVar4;
    uint_2 = spv::Builder::getUniqueId(&this->builder);
    uint_1 = 0x153;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_80,&uint_2,&local_38);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_80);
    IVar3 = spv::Builder::makeUintConstant(&this->builder,3,false);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_80);
    IVar3 = spv::Builder::makeBoolConstant(&this->builder,true,false);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    local_8c = spv::Builder::makeUintConstant(&this->builder,2,false);
    local_90 = spv::Builder::makeUintConstant(&this->builder,1,false);
    OVar1 = local_38;
    local_c8 = local_8c;
    local_c4 = local_8c;
    local_c0 = local_8c;
    local_bc = local_8c;
    local_b8 = &local_c8;
    local_b0 = 4;
    __l_00._M_len = 4;
    __l_00._M_array = local_b8;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_a8,__l_00,&local_c9);
    local_8c = spv::Builder::makeCompositeConstant(&this->builder,OVar1,&local_a8,false);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_a8);
    OVar1 = local_38;
    local_108 = local_90;
    local_104 = local_90;
    local_100 = local_90;
    local_fc = local_90;
    local_f8 = &local_108;
    local_f0 = 4;
    __l._M_len = 4;
    __l._M_array = local_f8;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_e8,__l,
               (allocator_type *)
               ((long)&shift_2._M_t.
                       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 7));
    local_90 = spv::Builder::makeCompositeConstant(&this->builder,OVar1,&local_e8,false);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_e8);
    or_2._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    or_2._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xc2;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_118,
               (uint *)((long)&or_2._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_38);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_80);
    IVar3 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    spv::Instruction::addIdOperand(pIVar5,local_8c);
    shift_1._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    shift_1._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xc5;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_128,
               (uint *)((long)&shift_1._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_38);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_128);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_80);
    IVar3 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_128);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    IVar3 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    or_1._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    or_1._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xc2;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_138,
               (uint *)((long)&or_1._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_38);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_138);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_128);
    IVar3 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_138);
    spv::Instruction::addIdOperand(pIVar5,local_90);
    load_invocation_id._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    load_invocation_id._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xc5;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_148,
               (uint *)((long)&load_invocation_id._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_38);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_148);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_128);
    IVar3 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_148);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_138);
    IVar3 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    and_invocation_id._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    and_invocation_id._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x3d;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_158,
               (uint *)((long)&and_invocation_id._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &bool_type);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_158);
    IVar3 = get_builtin_shader_input(this,BuiltInSubgroupLocalInvocationId);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    extract_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    extract_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 199;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_168,
               (uint *)((long)&extract_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &bool_type);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_168);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_158);
    IVar3 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_168);
    IVar3 = spv::Builder::makeUintConstant(&this->builder,0xfffffffc,false);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    result_id = spv::Builder::getUniqueId(&this->builder);
    local_180 = 0x155;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_178,&result_id,(Op *)((long)&func + 4));
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    IVar3 = spv::Builder::makeUintConstant(&this->builder,3,false);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_148);
    IVar3 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_168);
    IVar3 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    local_184 = spv::Instruction::getResultId(pIVar5);
    pBVar2 = _uvec4_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_190,&local_80);
    spv::Block::addInstruction(pBVar2,&local_190);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_190);
    pBVar2 = _uvec4_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_198,&local_118);
    spv::Block::addInstruction(pBVar2,&local_198);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_198);
    pBVar2 = _uvec4_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1a0,&local_128);
    spv::Block::addInstruction(pBVar2,&local_1a0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1a0);
    pBVar2 = _uvec4_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1a8,&local_138);
    spv::Block::addInstruction(pBVar2,&local_1a8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1a8);
    pBVar2 = _uvec4_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1b0,&local_148);
    spv::Block::addInstruction(pBVar2,&local_1b0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1b0);
    pBVar2 = _uvec4_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1b8,&local_158);
    spv::Block::addInstruction(pBVar2,&local_1b8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1b8);
    pBVar2 = _uvec4_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1c0,&local_168);
    spv::Block::addInstruction(pBVar2,&local_1c0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1c0);
    pBVar2 = _uvec4_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_1c8,&local_178);
    spv::Block::addInstruction(pBVar2,&local_1c8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1c8);
    spv::Builder::makeReturn(&this->builder,false,local_184);
    spv::Builder::setBuildPoint(&this->builder,entry);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    IVar3 = spv::Function::getId(local_48);
    this->is_quad_uniform_call_id = IVar3;
    this_local._4_4_ = this->is_quad_uniform_call_id;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_178);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_168);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_158);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_148);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_138);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_128);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_118);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_80);
  }
  else {
    this_local._4_4_ = this->is_quad_uniform_call_id;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id SPIRVModule::Impl::build_is_quad_uniform_control_flow(SPIRVModule &module)
{
	if (is_quad_uniform_call_id)
		return is_quad_uniform_call_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec4_type = builder.makeVectorType(uint_type, 4);
	spv::Id bool_type = builder.makeBoolType();

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, bool_type,
	                                       "IsQuadUniformControlFlow",
	                                       {}, {}, &entry);

	auto ballot_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBallot);
	ballot_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	ballot_op->addIdOperand(builder.makeBoolConstant(true));

	spv::Id uint_2 = builder.makeUintConstant(2);
	spv::Id uint_1 = builder.makeUintConstant(1);
	uint_2 = builder.makeCompositeConstant(uvec4_type, { uint_2, uint_2, uint_2, uint_2 });
	uint_1 = builder.makeCompositeConstant(uvec4_type, { uint_1, uint_1, uint_1, uint_1 });

	auto shift_2 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpShiftRightLogical);
	shift_2->addIdOperand(ballot_op->getResultId());
	shift_2->addIdOperand(uint_2);
	auto or_2 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseOr);
	or_2->addIdOperand(ballot_op->getResultId());
	or_2->addIdOperand(shift_2->getResultId());
	auto shift_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpShiftRightLogical);
	shift_1->addIdOperand(or_2->getResultId());
	shift_1->addIdOperand(uint_1);
	auto or_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseOr);
	or_1->addIdOperand(or_2->getResultId());
	or_1->addIdOperand(shift_1->getResultId());

	auto load_invocation_id = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
	load_invocation_id->addIdOperand(get_builtin_shader_input(spv::BuiltInSubgroupLocalInvocationId));

	auto and_invocation_id = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpBitwiseAnd);
	and_invocation_id->addIdOperand(load_invocation_id->getResultId());
	and_invocation_id->addIdOperand(builder.makeUintConstant(~3u));

	auto extract_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformBallotBitExtract);
	extract_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	extract_op->addIdOperand(or_1->getResultId());
	extract_op->addIdOperand(and_invocation_id->getResultId());
	spv::Id result_id = extract_op->getResultId();

	entry->addInstruction(std::move(ballot_op));
	entry->addInstruction(std::move(shift_2));
	entry->addInstruction(std::move(or_2));
	entry->addInstruction(std::move(shift_1));
	entry->addInstruction(std::move(or_1));
	entry->addInstruction(std::move(load_invocation_id));
	entry->addInstruction(std::move(and_invocation_id));
	entry->addInstruction(std::move(extract_op));

	builder.makeReturn(false, result_id);
	builder.setBuildPoint(current_build_point);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	builder.addCapability(spv::CapabilityGroupNonUniform);

	is_quad_uniform_call_id = func->getId();
	return is_quad_uniform_call_id;
}